

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QRhiVertexInputBinding *b)

{
  QTextStream *pQVar1;
  uint *in_RDX;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QDebugStateSaver saver;
  undefined1 *local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)b);
  pQVar1 = *(QTextStream **)b;
  pQVar1[0x30] = (QTextStream)0x0;
  QVar2.m_data = (storage_type *)0x1e;
  QVar2.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar2);
  QTextStream::operator<<(pQVar1,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((*(QTextStream **)b)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)b,' ');
  }
  QTextStream::operator<<(*(QTextStream **)b,*in_RDX);
  if ((*(QTextStream **)b)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)b,' ');
  }
  pQVar1 = *(QTextStream **)b;
  QVar3.m_data = &DAT_00000005;
  QVar3.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar3);
  QTextStream::operator<<(pQVar1,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((*(QTextStream **)b)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)b,' ');
  }
  QTextStream::operator<<(*(QTextStream **)b,in_RDX[1]);
  if ((*(QTextStream **)b)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)b,' ');
  }
  pQVar1 = *(QTextStream **)b;
  QVar4.m_data = (storage_type *)0xb;
  QVar4.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar4);
  QTextStream::operator<<(pQVar1,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((*(QTextStream **)b)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)b,' ');
  }
  QTextStream::operator<<(*(QTextStream **)b,in_RDX[2]);
  if ((*(QTextStream **)b)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)b,' ');
  }
  QTextStream::operator<<(*(QTextStream **)b,')');
  if ((*(QTextStream **)b)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)b,' ');
  }
  b->m_stride = 0;
  b->m_classification = PerVertex;
  *(undefined8 *)dbg.stream = *(undefined8 *)b;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QRhiVertexInputBinding &b)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QRhiVertexInputBinding(stride=" << b.stride()
                  << " cls=" << b.classification()
                  << " step-rate=" << b.instanceStepRate()
                  << ')';
    return dbg;
}